

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O2

bool __thiscall
glslang::TParseVersions::checkExtensionsRequested
          (TParseVersions *this,TSourceLoc *loc,int numExtensions,char **extensions,
          char *featureDesc)

{
  EShMessages EVar1;
  TInfoSink *this_00;
  char *__s;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  pool_allocator<char> local_d8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)numExtensions;
  if (numExtensions < 1) {
    uVar5 = uVar4;
  }
  while (uVar5 != uVar4) {
    iVar2 = (*this->_vptr_TParseVersions[7])(this,extensions[uVar4]);
    uVar4 = uVar4 + 1;
    if (0xfffffffd < iVar2 - 3U) {
      return true;
    }
  }
  uVar4 = 0;
  bVar3 = false;
  do {
    if (uVar5 == uVar4) {
      return bVar3;
    }
    iVar2 = (*this->_vptr_TParseVersions[7])(this,extensions[uVar4]);
    if (iVar2 == 3) {
LAB_0036c3d9:
      this_00 = this->infoSink;
      __s = extensions[uVar4];
      local_d8.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a8,__s,&local_d8);
      std::operator+(&local_80,"extension ",&local_a8);
      std::operator+(&local_58,&local_80," is being used for ");
      std::operator+(&local_d0,&local_58,featureDesc);
      TInfoSinkBase::message
                (&this_00->info,EPrefixWarning,local_d0._M_dataplus._M_p,loc,
                 (bool)((byte)(this->messages >> 0x10) & 1),
                 (bool)((byte)(this->messages >> 0x11) & 1));
      bVar3 = true;
    }
    else if ((iVar2 == 4) &&
            (EVar1 = this->messages, (EVar1 & EShMsgRelaxedErrors) != EShMsgDefault)) {
      TInfoSinkBase::message
                (&this->infoSink->info,EPrefixWarning,
                 "The following extension must be enabled to use this feature:",loc,
                 (bool)((byte)(EVar1 >> 0x10) & 1),(bool)((byte)(EVar1 >> 0x11) & 1));
      goto LAB_0036c3d9;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool TParseVersions::checkExtensionsRequested(const TSourceLoc& loc, int numExtensions, const char* const extensions[], const char* featureDesc)
{
    // First, see if any of the extensions are enabled
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhEnable || behavior == EBhRequire)
            return true;
    }

    // See if any extensions want to give a warning on use; give warnings for all such extensions
    bool warned = false;
    for (int i = 0; i < numExtensions; ++i) {
        TExtensionBehavior behavior = getExtensionBehavior(extensions[i]);
        if (behavior == EBhDisable && relaxedErrors()) {
            infoSink.info.message(EPrefixWarning, "The following extension must be enabled to use this feature:", loc,
                                  messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            behavior = EBhWarn;
        }
        if (behavior == EBhWarn) {
            infoSink.info.message(EPrefixWarning,
                                  ("extension " + TString(extensions[i]) + " is being used for " + featureDesc).c_str(),
                                  loc, messages & EShMsgAbsolutePath, messages & EShMsgDisplayErrorColumn);
            warned = true;
        }
    }
    if (warned)
        return true;
    return false;
}